

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O2

Pass * wasm::createAlignmentLoweringPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x130);
  memset(this,0,0x130);
  AlignmentLowering::AlignmentLowering((AlignmentLowering *)this);
  return this;
}

Assistant:

Pass* createAlignmentLoweringPass() { return new AlignmentLowering(); }